

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_case_start(ConsoleReporter *this,TestCaseData *in)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer this_00;
  
  this->hasLoggedCurrentTestStart = false;
  this->tc = in;
  pSVar1 = (this->subcasesStack).
           super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->subcasesStack).
           super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pSVar1;
  if (pSVar2 != pSVar1) {
    do {
      String::~String(&this_00->m_name);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar2);
    (this->subcasesStack).
    super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>.
    _M_impl.super__Vector_impl_data._M_finish = pSVar1;
  }
  this->currentSubcaseLevel = 0;
  return;
}

Assistant:

void test_case_start(const TestCaseData& in) override {
            hasLoggedCurrentTestStart = false;
            tc                        = &in;
            subcasesStack.clear();
            currentSubcaseLevel = 0;
        }